

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticEmitterSystem.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::UnderwaterAcousticEmitterSystem
          (UnderwaterAcousticEmitterSystem *this)

{
  UnderwaterAcousticEmitterSystem *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__UnderwaterAcousticEmitterSystem_00331bf8;
  this->m_ui8EmitterSystemDataLength = '\x05';
  this->m_ui8NumBeams = '\0';
  this->m_ui16Padding1 = 0;
  AcousticEmitterSystem::AcousticEmitterSystem(&this->m_AES);
  Vector::Vector(&this->m_Location);
  std::
  vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
  ::vector(&this->m_vUAEB);
  return;
}

Assistant:

UnderwaterAcousticEmitterSystem::UnderwaterAcousticEmitterSystem() :
    m_ui8EmitterSystemDataLength( UNDERWATER_ACOUSTIC_EMITTER_SYSTEM_SIZE / 4 ),
    m_ui8NumBeams( 0 ),
    m_ui16Padding1( 0 )
{
}